

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

_Bool Curl_alpn_contains_proto(alpn_spec *spec,char *proto)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  
  if ((proto != (char *)0x0) && (__n = strlen(proto), __n != 0 && spec != (alpn_spec *)0x0)) {
    sVar3 = spec->count;
    while( true ) {
      bVar4 = sVar3 != 0;
      sVar3 = sVar3 - 1;
      if (!bVar4) {
        return bVar4;
      }
      sVar2 = strlen((char *)spec);
      if ((sVar2 == __n) && (iVar1 = bcmp(proto,spec,__n), iVar1 == 0)) break;
      spec = (alpn_spec *)(spec->entries + 1);
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool Curl_alpn_contains_proto(const struct alpn_spec *spec,
                              const char *proto)
{
  size_t i, plen = proto ? strlen(proto) : 0;
  for(i = 0; spec && plen && i < spec->count; ++i) {
    size_t slen = strlen(spec->entries[i]);
    if((slen == plen) && !memcmp(proto, spec->entries[i], plen))
      return TRUE;
  }
  return FALSE;
}